

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

void rw::gl3::rasterUnlock(Raster *raster,int32 level)

{
  raster->width = raster->originalWidth;
  raster->height = raster->originalHeight;
  raster->stride = raster->originalStride;
  raster->pixels = raster->originalPixels;
  raster->privateFlags = 0;
  return;
}

Assistant:

void
rasterUnlock(Raster *raster, int32 level)
{
#ifdef RW_OPENGL
	Gl3Raster *natras = GETGL3RASTEREXT(raster);

	assert(raster->pixels);

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
	case Raster::CAMERATEXTURE:
		if(raster->privateFlags & Raster::LOCKWRITE){
			uint32 prev = bindTexture(natras->texid);
			if(natras->isCompressed){
				glCompressedTexImage2D(GL_TEXTURE_2D, level, natras->internalFormat,
					raster->width, raster->height, 0,
					getLevelSize(raster, level),
					raster->pixels);
				if(natras->backingStore){
					assert(level < natras->backingStore->numlevels);
					memcpy(natras->backingStore->levels[level].data, raster->pixels,
						natras->backingStore->levels[level].size);
				}
			}else{
				glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
				glTexImage2D(GL_TEXTURE_2D, level, natras->internalFormat,
					     raster->width, raster->height,
					     0, natras->format, natras->type, raster->pixels);
			}
			if(level == 0 && natras->autogenMipmap)
				glGenerateMipmap(GL_TEXTURE_2D);
			bindTexture(prev);
		}
		break;

	case Raster::CAMERA:
		// TODO: write?
		break;
	}

	rwFree(raster->pixels);
	raster->pixels = nil;
#endif
	raster->width = raster->originalWidth;
	raster->height = raster->originalHeight;
	raster->stride = raster->originalStride;
	raster->pixels = raster->originalPixels;
	raster->privateFlags = 0;
}